

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage2d_neg_level
               (NegativeTestContext *ctx)

{
  int faceIterTcu;
  uint uVar1;
  GLenum GVar2;
  GLenum *pGVar3;
  GLuint textures [2];
  string local_40;
  
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,textures);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,textures[0]);
  uVar1 = 0;
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,textures[1]);
  pGVar3 = &DAT_009b2cdc;
  do {
    GVar2 = 0;
    if (uVar1 < 6) {
      GVar2 = *pGVar3;
    }
    glu::CallLogWrapper::glTexImage2D
              (&ctx->super_CallLogWrapper,GVar2,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0);
    uVar1 = uVar1 + 1;
    pGVar3 = pGVar3 + 1;
  } while (uVar1 != 6);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"GL_INVALID_VALUE is generated if level is less than 0.","");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  uVar1 = 0;
  glu::CallLogWrapper::glCopyTexSubImage2D(&ctx->super_CallLogWrapper,0xde1,-1,0,0,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  pGVar3 = &DAT_009b2cdc;
  do {
    GVar2 = 0;
    if (uVar1 < 6) {
      GVar2 = *pGVar3;
    }
    glu::CallLogWrapper::glCopyTexSubImage2D(&ctx->super_CallLogWrapper,GVar2,-1,0,0,0,0,4,4);
    NegativeTestContext::expectError(ctx,0x501);
    uVar1 = uVar1 + 1;
    pGVar3 = pGVar3 + 1;
  } while (uVar1 != 6);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,2,textures);
  return;
}

Assistant:

void copytexsubimage2d_neg_level (NegativeTestContext& ctx)
{
	GLuint textures[2];
	ctx.glGenTextures	(2, &textures[0]);
	ctx.glBindTexture	(GL_TEXTURE_2D, textures[0]);
	ctx.glTexImage2D	(GL_TEXTURE_2D, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture	(GL_TEXTURE_CUBE_MAP, textures[1]);
	FOR_CUBE_FACES(faceGL, ctx.glTexImage2D(faceGL, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0););

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0.");
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, -1, 0, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	FOR_CUBE_FACES(faceGL,
	{
		ctx.glCopyTexSubImage2D(faceGL, -1, 0, 0, 0, 0, 4, 4);
		ctx.expectError(GL_INVALID_VALUE);
	});
	ctx.endSection();

	ctx.glDeleteTextures(2, &textures[0]);
}